

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLogTestCase.cpp
# Opt level: O2

void anon_unknown.dwarf_1fb73f::deleteLogSession(string *sender,string *target)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"log/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".event.current.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".event.backup.1.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".event.backup.2.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".event.backup.3.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".event.backup.4.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".event.backup.5.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages.current.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages.backup.1.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages.backup.2.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages.backup.3.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages.backup.4.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_38,"log/backup/FIX.4.2-",sender);
  std::operator+(&bStack_98,&local_38,"-");
  std::operator+(&local_78,&bStack_98,target);
  std::operator+(&local_58,&local_78,".messages.backup.5.log");
  FIX::file_unlink(local_58._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void deleteLogSession(std::string sender, std::string target) {
  file_unlink(("log/FIX.4.2-" + sender + "-" + target + ".event.current.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.1.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.2.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.3.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.4.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".event.backup.5.log").c_str());

  file_unlink(("log/FIX.4.2-" + sender + "-" + target + ".messages.current.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.1.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.2.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.3.log").c_str());
  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.4.log").c_str());

  file_unlink(("log/backup/FIX.4.2-" + sender + "-" + target + ".messages.backup.5.log").c_str());
}